

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

int handle_if(dmr_C *C,stream *stream,token **line,token *token)

{
  int true_value;
  
  true_value = 0;
  if (C->false_nesting == 0) {
    true_value = expression_value(C,&token->next);
  }
  if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
    stream->protect = (ident *)0x0;
  }
  preprocessor_if(C,stream,token,true_value);
  return 0;
}

Assistant:

static int handle_if(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
	int value = 0;
        
        (void)line;
	if (!C->false_nesting)
		value = expression_value(C, &token->next);

	dirty_stream(stream);
	return preprocessor_if(C, stream, token, value);
}